

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

void Fra_ClauMinimizeClause_rec(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vVec2;
  int nSizeOld;
  Vec_Int_t *vExtra2;
  Vec_Int_t *vExtra_local;
  Vec_Int_t *vBasis_local;
  Cla_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vExtra);
  if (iVar1 != 1) {
    iVar1 = Vec_IntSize(vBasis);
    vVec2 = Vec_IntSplitHalf(vExtra);
    Vec_IntAppend(vBasis,vExtra);
    iVar2 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
    if (iVar2 == 0) {
      Vec_IntShrink(vBasis,iVar1);
      Vec_IntAppend(vBasis,vVec2);
      iVar2 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
      if (iVar2 == 0) {
        Fra_ClauMinimizeClause_rec(p,vBasis,vExtra);
        Vec_IntShrink(vBasis,iVar1);
        Vec_IntAppend(vBasis,vExtra);
        Fra_ClauMinimizeClause_rec(p,vBasis,vVec2);
        Vec_IntShrink(vBasis,iVar1);
        Vec_IntAppend(vExtra,vVec2);
        Vec_IntFree(vVec2);
      }
      else {
        Vec_IntShrink(vBasis,iVar1);
        Fra_ClauMinimizeClause_rec(p,vBasis,vVec2);
      }
    }
    else {
      Vec_IntShrink(vBasis,iVar1);
      Fra_ClauMinimizeClause_rec(p,vBasis,vExtra);
    }
  }
  return;
}

Assistant:

void Fra_ClauMinimizeClause_rec( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    Vec_Int_t * vExtra2;
    int nSizeOld;
    if ( Vec_IntSize(vExtra) == 1 )
        return;
    nSizeOld = Vec_IntSize( vBasis );
    vExtra2 = Vec_IntSplitHalf( vExtra );

    // try the first half
    Vec_IntAppend( vBasis, vExtra );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
        return;
    }
    Vec_IntShrink( vBasis, nSizeOld );

    // try the second half
    Vec_IntAppend( vBasis, vExtra2 );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
        return;
    }
//    Vec_IntShrink( vBasis, nSizeOld );

    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vBasis, vExtra );
    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vExtra, vExtra2 );
    Vec_IntFree( vExtra2 );
}